

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LoadFunctionBodyAsArgument
          (Lowerer *this,Instr *instr,IntConstOpnd *functionBodySlotOpnd,RegOpnd *envOpnd)

{
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *this_00;
  FunctionInfoPtrPtr address;
  undefined4 *puVar3;
  AddrOpnd *opndArg;
  Instr *pIVar4;
  
  this_00 = Func::GetJITFunctionBody(instr->m_func);
  address = JITTimeFunctionBody::GetNestedFuncRef
                      (this_00,(uint)(functionBodySlotOpnd->super_EncodableOpnd<long>).m_value);
  if (address == (FunctionInfoPtrPtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1627,"(infoRef)",
                       "Expected FunctionProxy for index of NewScFunc or NewScGenFunc opnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
  pIVar4 = LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&envOpnd->super_Opnd);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::LoadFunctionBodyAsArgument(IR::Instr *instr, IR::IntConstOpnd * functionBodySlotOpnd, IR::RegOpnd * envOpnd)
{
    IR::Instr * instrPrev;

    // We need to pass in the function reference, we can't embed the pointer to the function proxy here.
    // The function proxy may be deferred parsed/serialize, and may 'progress' to a real function body after it is undeferred
    // At which point the deferred function proxy may be collect.
    // Just pass it the address where we will find the function proxy/body

    Js::FunctionInfoPtrPtr infoRef = instr->m_func->GetJITFunctionBody()->GetNestedFuncRef((uint)functionBodySlotOpnd->GetValue());
    AssertMsg(infoRef, "Expected FunctionProxy for index of NewScFunc or NewScGenFunc opnd");

    IR::AddrOpnd * indexOpnd = IR::AddrOpnd::New((Js::Var)infoRef, IR::AddrOpndKindDynamicMisc, m_func);
    instrPrev = m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    m_lowererMD.LoadHelperArgument(instr, envOpnd);

    return instrPrev;
}